

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall fasttext::Loss::predict(Loss *this,Predictions *predictions,State *state)

{
  pointer pfVar1;
  int iVar2;
  undefined8 in_RAX;
  real rVar3;
  undefined8 local_28;
  
  local_28 = in_RAX;
  (*this->_vptr_Loss[3])(this,state);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::reserve
            (predictions,
             (long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  iVar2 = 0;
  while( true ) {
    local_28 = CONCAT44(local_28._4_4_,iVar2);
    pfVar1 = (state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(state->output).data_.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar1 >> 2 <= (long)iVar2) break;
    rVar3 = std_log(pfVar1[iVar2]);
    local_28 = CONCAT44(rVar3,(int)local_28);
    std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::emplace_back<float,int&>
              ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)predictions,
               (float *)((long)&local_28 + 4),(int *)&local_28);
    iVar2 = (int)local_28 + 1;
  }
  return;
}

Assistant:

void Loss::predict(Predictions& predictions, Model::State& state) const {
  computeOutput(state);
  const Vector& output = state.output;
  predictions.reserve(output.size());
  for (int32_t i = 0; i < output.size(); i++) {
    predictions.emplace_back(std_log(output[i]), i);
  }
}